

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaStringPtr::Destroy
          (ArenaStringPtr *this,string *default_value,Arena *arena)

{
  pointer pcVar1;
  string *psVar2;
  
  if ((arena == (Arena *)0x0) && ((string *)(this->tagged_ptr_).ptr_ != default_value)) {
    psVar2 = UnsafeMutablePointer_abi_cxx11_(this);
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &psVar2->field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(psVar2);
    return;
  }
  return;
}

Assistant:

void ArenaStringPtr::Destroy(const std::string* default_value,
                             ::google::protobuf::Arena* arena) {
  if (arena == nullptr) {
    GOOGLE_DCHECK(!IsDonatedString());
    if (!IsDefault(default_value)) {
      delete UnsafeMutablePointer();
    }
  }
}